

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O3

XXH64_hash_t XXH3_len_1to3_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  ulong uVar1;
  
  uVar1 = (((ulong)((uint)*input << 0x10 | (int)len << 8 | (uint)input[len >> 1] << 0x18) |
           (ulong)input[len - 1]) ^ (ulong)(secret + 0x87275a9b)) * -0x61c8864e7a143579;
  uVar1 = (uVar1 >> 0x25 ^ uVar1) * 0x165667919e3779f9;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t
XXH3_len_1to3_64b(const xxh_u8* input, size_t len, const xxh_u8* secret, XXH64_hash_t seed)
{
    XXH_ASSERT(input != NULL);
    XXH_ASSERT(1 <= len && len <= 3);
    XXH_ASSERT(secret != NULL);
    /*
     * len = 1: combined = { input[0], 0x01, input[0], input[0] }
     * len = 2: combined = { input[1], 0x02, input[0], input[1] }
     * len = 3: combined = { input[2], 0x03, input[0], input[1] }
     */
    {   xxh_u8 const c1 = input[0];
        xxh_u8 const c2 = input[len >> 1];
        xxh_u8 const c3 = input[len - 1];
        xxh_u32 const combined = ((xxh_u32)c1<<16) | (((xxh_u32)c2) << 24) | (((xxh_u32)c3) << 0) | (((xxh_u32)len) << 8);
        xxh_u64 const bitflip = (XXH_readLE32(secret) ^ XXH_readLE32(secret+4)) + seed;
        xxh_u64 const keyed = (xxh_u64)combined ^ bitflip;
        xxh_u64 const mixed = keyed * PRIME64_1;
        return XXH3_avalanche(mixed);
    }
}